

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printManifest(char *fileName)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  Header *pHVar5;
  size_t sVar6;
  void *pvVar7;
  char *in_RDI;
  size_t size;
  CompressedIDManifest *mfst;
  int part;
  MultiPartInputFile in;
  IDManifest *in_stack_00000290;
  MultiPartInputFile *in_stack_ffffffffffffff10;
  IDManifest local_68 [24];
  ulong local_50;
  CompressedIDManifest *local_48;
  int local_2c;
  MultiPartInputFile local_28 [32];
  char *local_8;
  
  local_8 = in_RDI;
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(local_28,in_RDI,iVar2,true);
  local_2c = 0;
  while( true ) {
    iVar2 = local_2c;
    iVar3 = Imf_3_4::MultiPartInputFile::parts();
    if (iVar3 <= iVar2) break;
    iVar2 = Imf_3_4::MultiPartInputFile::parts();
    if (1 < iVar2) {
      poVar4 = std::operator<<((ostream *)&std::cout,local_8);
      poVar4 = std::operator<<(poVar4," part ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_2c);
      std::operator<<(poVar4,":\n");
    }
    pHVar5 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_28);
    bVar1 = Imf_3_4::hasIDManifest(pHVar5);
    if ((bVar1 & 1) == 0) {
      std::operator<<((ostream *)&std::cout,"no manifest found\n");
    }
    else {
      pHVar5 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_28);
      local_48 = (CompressedIDManifest *)Imf_3_4::idManifest(pHVar5);
      Imf_3_4::IDManifest::IDManifest(local_68,local_48);
      sVar6 = dumpManifest(in_stack_00000290);
      Imf_3_4::IDManifest::~IDManifest((IDManifest *)0x1043f3);
      local_50 = sVar6;
      poVar4 = std::operator<<((ostream *)&std::cout,"raw text size    : ");
      pvVar7 = (void *)std::ostream::operator<<(poVar4,local_50);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"uncompressed size: ");
      pvVar7 = (void *)std::ostream::operator<<(poVar4,*(ulong *)(local_48 + 8));
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"compressed size  : ");
      in_stack_ffffffffffffff10 =
           (MultiPartInputFile *)std::ostream::operator<<(poVar4,*(int *)local_48);
      std::ostream::operator<<(in_stack_ffffffffffffff10,std::endl<char,std::char_traits<char>>);
    }
    local_2c = local_2c + 1;
  }
  Imf_3_4::MultiPartInputFile::~MultiPartInputFile(in_stack_ffffffffffffff10);
  return;
}

Assistant:

void
printManifest (const char fileName[])
{

    MultiPartInputFile in (fileName);
    //
    // extract objectID attribute
    //

    for (int part = 0; part < in.parts (); part++)
    {
        if (in.parts () > 1) { cout << fileName << " part " << part << ":\n"; }
        if (hasIDManifest (in.header (part)))
        {
            const OPENEXR_IMF_NAMESPACE::CompressedIDManifest& mfst =
                idManifest (in.header (part));
            size_t size = dumpManifest (mfst);
            cout << "raw text size    : " << size << endl;
            cout << "uncompressed size: " << mfst._uncompressedDataSize << endl;
            cout << "compressed size  : " << mfst._compressedDataSize << endl;
        }
        else { cout << "no manifest found\n"; }
    }
}